

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O1

int platform_ssh_share(char *pi_name,Conf *conf,Plug *downplug,Plug *upplug,Socket **sock,
                      char **logtext,char **ds_err,char **us_err,_Bool can_upstream,
                      _Bool can_downstream)

{
  int __fd;
  int iVar1;
  char *dirname;
  char *pcVar2;
  char *pcVar3;
  SockAddr *pSVar4;
  Socket *pSVar5;
  char *pcVar6;
  int *piVar7;
  
  dirname = make_dirname(pi_name,logtext);
  if (dirname == (char *)0x0) {
    return 0;
  }
  pcVar2 = make_dir_and_check_ours(dirname);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = dupcat_fn(dirname,"/lock",0);
    __fd = open(pcVar2,0x242,0x180);
    if (-1 < __fd) {
      iVar1 = flock(__fd,2);
      if (iVar1 < 0) {
        piVar7 = __errno_location();
        pcVar3 = strerror(*piVar7);
        iVar1 = 0;
        pcVar3 = dupprintf("%s: flock(LOCK_EX): %s",pcVar2,pcVar3);
        *logtext = pcVar3;
        safefree(dirname);
        safefree(pcVar2);
LAB_0013a6a3:
        close(__fd);
        return iVar1;
      }
      pcVar3 = dupprintf("%s/socket",dirname);
      *logtext = (char *)0x0;
      if (can_downstream) {
        pSVar4 = unix_sock_addr(pcVar3);
        iVar1 = 1;
        pSVar5 = new_connection(pSVar4,anon_var_dwarf_34748 + 10,0,false,true,false,false,downplug,
                                conf,(Interactor *)0x0);
        pcVar6 = (*pSVar5->vt->socket_error)(pSVar5);
        if (pcVar6 == (char *)0x0) {
          safefree(*logtext);
          *logtext = pcVar3;
          *sock = pSVar5;
          safefree(dirname);
          safefree(pcVar2);
          goto LAB_0013a6a3;
        }
        safefree(*ds_err);
        pcVar6 = (*pSVar5->vt->socket_error)(pSVar5);
        pcVar6 = dupprintf("%s: %s",pcVar3,pcVar6);
        *ds_err = pcVar6;
        (*pSVar5->vt->close)(pSVar5);
      }
      if (can_upstream) {
        pSVar4 = unix_sock_addr(pcVar3);
        pSVar5 = new_unix_listener(pSVar4,upplug);
        pcVar6 = (*pSVar5->vt->socket_error)(pSVar5);
        if (pcVar6 == (char *)0x0) {
          safefree(*logtext);
          *logtext = pcVar3;
          *sock = pSVar5;
          safefree(dirname);
          safefree(pcVar2);
          close(__fd);
          return 2;
        }
        safefree(*us_err);
        pcVar6 = (*pSVar5->vt->socket_error)(pSVar5);
        pcVar6 = dupprintf("%s: %s",pcVar3,pcVar6);
        *us_err = pcVar6;
        (*pSVar5->vt->close)(pSVar5);
      }
      if (((*logtext == (char *)0x0) && (*ds_err == (char *)0x0)) && (*us_err == (char *)0x0)) {
        __assert_fail("*logtext || *ds_err || *us_err",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/sharing.c"
                      ,0x14c,
                      "int platform_ssh_share(const char *, Conf *, Plug *, Plug *, Socket **, char **, char **, char **, _Bool, _Bool)"
                     );
      }
      safefree(dirname);
      safefree(pcVar2);
      safefree(pcVar3);
      close(__fd);
      return 0;
    }
    piVar7 = __errno_location();
    pcVar3 = strerror(*piVar7);
    pcVar3 = dupprintf("%s: open: %s",pcVar2,pcVar3);
    *logtext = pcVar3;
    safefree(dirname);
  }
  else {
    *logtext = pcVar2;
    pcVar2 = dirname;
  }
  safefree(pcVar2);
  return 0;
}

Assistant:

int platform_ssh_share(const char *pi_name, Conf *conf,
                       Plug *downplug, Plug *upplug, Socket **sock,
                       char **logtext, char **ds_err, char **us_err,
                       bool can_upstream, bool can_downstream)
{
    char *dirname, *lockname, *sockname, *err;
    int lockfd;
    Socket *retsock;

    /*
     * Sort out what we're going to call the directory in which we
     * keep the socket. This has the side effect of potentially
     * creating its top-level containing dir and/or the salt file
     * within that, if they don't already exist.
     */
    dirname = make_dirname(pi_name, logtext);
    if (!dirname) {
        return SHARE_NONE;
    }

    /*
     * Now make sure the subdirectory exists.
     */
    if ((err = make_dir_and_check_ours(dirname)) != NULL) {
        *logtext = err;
        sfree(dirname);
        return SHARE_NONE;
    }

    /*
     * Acquire a lock on a file in that directory.
     */
    lockname = dupcat(dirname, "/lock");
    lockfd = open(lockname, O_CREAT | O_RDWR | O_TRUNC, 0600);
    if (lockfd < 0) {
        *logtext = dupprintf("%s: open: %s", lockname, strerror(errno));
        sfree(dirname);
        sfree(lockname);
        return SHARE_NONE;
    }
    if (flock(lockfd, LOCK_EX) < 0) {
        *logtext = dupprintf("%s: flock(LOCK_EX): %s",
                             lockname, strerror(errno));
        sfree(dirname);
        sfree(lockname);
        close(lockfd);
        return SHARE_NONE;
    }

    sockname = dupprintf("%s/socket", dirname);

    *logtext = NULL;

    if (can_downstream) {
        retsock = new_connection(unix_sock_addr(sockname),
                                 "", 0, false, true, false, false,
                                 downplug, conf, NULL);
        if (sk_socket_error(retsock) == NULL) {
            sfree(*logtext);
            *logtext = sockname;
            *sock = retsock;
            sfree(dirname);
            sfree(lockname);
            close(lockfd);
            return SHARE_DOWNSTREAM;
        }
        sfree(*ds_err);
        *ds_err = dupprintf("%s: %s", sockname, sk_socket_error(retsock));
        sk_close(retsock);
    }

    if (can_upstream) {
        retsock = new_unix_listener(unix_sock_addr(sockname), upplug);
        if (sk_socket_error(retsock) == NULL) {
            sfree(*logtext);
            *logtext = sockname;
            *sock = retsock;
            sfree(dirname);
            sfree(lockname);
            close(lockfd);
            return SHARE_UPSTREAM;
        }
        sfree(*us_err);
        *us_err = dupprintf("%s: %s", sockname, sk_socket_error(retsock));
        sk_close(retsock);
    }

    /* One of the above clauses ought to have happened. */
    assert(*logtext || *ds_err || *us_err);

    sfree(dirname);
    sfree(lockname);
    sfree(sockname);
    close(lockfd);
    return SHARE_NONE;
}